

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServer.cxx
# Opt level: O1

void __thiscall cmDebugServer::ProcessBroadcastQueue(cmDebugServer *this)

{
  pointer pbVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  pointer pbVar3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->BroadcastQueueMutex);
  if (iVar2 == 0) {
    pbVar1 = (this->BroadcastQueue).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar3 = (this->BroadcastQueue).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar3 != pbVar1; pbVar3 = pbVar3 + 1)
    {
      (*(this->super_cmServerBase)._vptr_cmServerBase[10])(this,pbVar3);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->BroadcastQueue,
                      (this->BroadcastQueue).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    pthread_mutex_unlock((pthread_mutex_t *)&this->BroadcastQueueMutex);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void cmDebugServer::ProcessBroadcastQueue()
{
  std::lock_guard<std::mutex> l(BroadcastQueueMutex);
  for (auto& msg : BroadcastQueue) {
    this->Broadcast(msg);
  }
  this->BroadcastQueue.clear();
}